

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onExitFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  pointer pCVar1;
  pointer psVar2;
  pointer psVar3;
  pointer pVVar4;
  long lVar5;
  element_type *peVar6;
  ClosureContext *cc;
  pointer pCVar7;
  ByteCode bc;
  Function local_d0;
  long local_90;
  undefined1 auStack_88 [8];
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> closures;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> local_68;
  vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_48;
  
  emit(this,LoadUndefinedConstant);
  emit(this,Return);
  local_90 = (long)(this->functions).
                   super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->functions).
                   super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  auStack_88 = (undefined1  [8])0x0;
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar6 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pCVar7 = (peVar6->closures).
           super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (peVar6->closures).
           super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar1) {
    do {
      std::vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>>::
      emplace_back<unsigned_long_const&,unsigned_long_const&>
                ((vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>> *)
                 auStack_88,&pCVar7->outerScopeCount,&pCVar7->localScopeIndex);
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar1);
    peVar6 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  psVar2 = (node->parameters).
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (node->parameters).
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (peVar6->variables).
           super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)(peVar6->variables).
                super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            (&local_68,
             (vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             auStack_88);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            (&local_48,
             &((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->byteCode);
  local_d0.argumentCount = (long)psVar2 - (long)psVar3 >> 4;
  local_d0.localsCount = ((long)pVVar4 - lVar5 >> 3) * -0x3333333333333333;
  local_d0.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d0.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_d0.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d0.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d0.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::
  emplace_back<bytecode::Function>(&this->functions,&local_d0);
  lVar5 = local_90;
  if (local_d0.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.byteCode.
                    super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.byteCode.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.byteCode.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.closures.
      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.closures.
                    super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.closures.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.closures.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  popEmissionContext(this);
  bc.parameter = lVar5 >> 6;
  bc._0_8_ = 0x14;
  EmissionContext::EmitByteCode
            ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,bc);
  if (auStack_88 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_88,
                    (long)closures.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
  }
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {

    this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
    this->emit(bytecode::ByteCodeInstruction::Return);

    std::size_t fnIndex = this->functions.size();

    std::vector<bytecode::ClosureContext> closures;

    for (const auto& cc : this->ec->closures) {
      closures.emplace_back(cc.outerScopeCount, cc.localScopeIndex);
    }

    this->functions.emplace_back(bytecode::Function{
      node->parameters.size(),
      this->ec->variables.size(),
      closures,
      this->ec->byteCode
    });

    this->popEmissionContext();

    this->emit(bytecode::ByteCodeInstruction::MakeFn, fnIndex);
  }